

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mbedtls_mpi_mul_int(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi_uint b)

{
  mbedtls_mpi *X_00;
  long in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  int ret;
  size_t n;
  mbedtls_mpi_sint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffd4;
  int local_4;
  
  X_00 = (mbedtls_mpi *)(ulong)*(ushort *)((long)in_RSI + 10);
  while( true ) {
    uVar1 = in_stack_ffffffffffffffd0 & 0xffffff;
    if (X_00 != (mbedtls_mpi *)0x0) {
      uVar1 = CONCAT13(*(long *)(*in_RSI + (long)&X_00[-1].field_0xf * 8) == 0,
                       (int3)in_stack_ffffffffffffffd0);
    }
    if ((char)(uVar1 >> 0x18) == '\0') break;
    X_00 = (mbedtls_mpi *)&X_00[-1].field_0xf;
    in_stack_ffffffffffffffd0 = uVar1;
  }
  if ((in_RDX == 0) || (X_00 == (mbedtls_mpi *)0x0)) {
    local_4 = mbedtls_mpi_lset((mbedtls_mpi *)CONCAT44(in_stack_ffffffffffffffd4,uVar1),
                               in_stack_ffffffffffffffc8);
  }
  else {
    local_4 = mbedtls_mpi_grow(X_00,CONCAT44(0xffffff92,uVar1));
    if ((local_4 == 0) &&
       (local_4 = mbedtls_mpi_copy(X_00,(mbedtls_mpi *)(ulong)uVar1), local_4 == 0)) {
      mbedtls_mpi_core_mla
                ((mbedtls_mpi_uint *)*in_RDI,(ulong)*(ushort *)((long)in_RDI + 10),
                 (mbedtls_mpi_uint *)*in_RSI,(size_t)X_00,in_RDX - 1);
    }
  }
  return local_4;
}

Assistant:

int mbedtls_mpi_mul_int(mbedtls_mpi *X, const mbedtls_mpi *A, mbedtls_mpi_uint b)
{
    size_t n = A->n;
    while (n > 0 && A->p[n - 1] == 0) {
        --n;
    }

    /* The general method below doesn't work if b==0. */
    if (b == 0 || n == 0) {
        return mbedtls_mpi_lset(X, 0);
    }

    /* Calculate A*b as A + A*(b-1) to take advantage of mbedtls_mpi_core_mla */
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    /* In general, A * b requires 1 limb more than b. If
     * A->p[n - 1] * b / b == A->p[n - 1], then A * b fits in the same
     * number of limbs as A and the call to grow() is not required since
     * copy() will take care of the growth if needed. However, experimentally,
     * making the call to grow() unconditional causes slightly fewer
     * calls to calloc() in ECP code, presumably because it reuses the
     * same mpi for a while and this way the mpi is more likely to directly
     * grow to its final size.
     *
     * Note that calculating A*b as 0 + A*b doesn't work as-is because
     * A,X can be the same. */
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, n + 1));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(X, A));
    mbedtls_mpi_core_mla(X->p, X->n, A->p, n, b - 1);

cleanup:
    return ret;
}